

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool copyFileIfNewer(QString *sourceFileName,QString *destinationFileName,Options *options,
                    bool forceOverwrite)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  ulong uVar5;
  char *pcVar6;
  char *pcVar7;
  byte in_CL;
  long in_RDX;
  QString *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QFileInfo sourceFileInfo;
  QFileInfo destinationFileInfo;
  undefined7 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7f;
  QDateTime *in_stack_fffffffffffffe80;
  FILE *pFVar8;
  QString *in_stack_fffffffffffffe98;
  byte local_13a;
  byte local_111;
  QFileInfo local_b0 [8];
  undefined1 local_a8 [24];
  undefined1 local_90 [24];
  QDir local_78 [32];
  QFile local_58 [40];
  QDateTime local_30 [8];
  QDateTime local_28 [8];
  undefined8 local_20;
  undefined8 local_18;
  _Optional_payload_base<QFlags<QFileDevice::Permission>_> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QList<QString>::operator<<
            ((QList<QString> *)in_stack_fffffffffffffe80,
             (parameter_type)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
  uVar5 = QFile::exists((QString *)in_RSI);
  if ((uVar5 & 1) != 0) {
    local_18 = 0xaaaaaaaaaaaaaaaa;
    QFileInfo::QFileInfo((QFileInfo *)&local_18,(QString *)in_RSI);
    local_20 = 0xaaaaaaaaaaaaaaaa;
    QFileInfo::QFileInfo((QFileInfo *)&local_20,(QString *)in_RDI);
    bVar2 = false;
    bVar1 = false;
    local_13a = 0;
    if ((in_CL & 1) == 0) {
      QFileInfo::lastModified
                ((QFileInfo *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
      bVar2 = true;
      QFileInfo::lastModified
                ((QFileInfo *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
      bVar1 = true;
      bVar3 = operator<=(in_stack_fffffffffffffe80,
                         (QDateTime *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78))
      ;
      local_13a = 0;
      if (bVar3) {
        bVar3 = alwaysOverwritableFile(in_RDI);
        local_13a = bVar3 ^ 0xff;
      }
    }
    if (bVar1) {
      QDateTime::~QDateTime(local_30);
    }
    if (bVar2) {
      QDateTime::~QDateTime(local_28);
    }
    pFVar8 = _stdout;
    if ((local_13a & 1) == 0) {
      QFile::QFile(local_58,(QString *)in_RSI);
      bVar4 = QFile::remove();
      QFile::~QFile(local_58);
      pFVar8 = _stderr;
      if (((bVar4 ^ 0xff) & 1) == 0) {
        bVar1 = false;
      }
      else {
        QtPrivate::asString(in_RSI);
        QString::toLocal8Bit(in_stack_fffffffffffffe98);
        pcVar6 = QByteArray::constData((QByteArray *)0x10ce50);
        fprintf(pFVar8,"Can\'t remove old file: %s\n",pcVar6);
        QByteArray::~QByteArray((QByteArray *)0x10ce73);
        local_111 = 0;
        bVar1 = true;
      }
    }
    else {
      if ((*(byte *)(in_RDX + 1) & 1) != 0) {
        QtPrivate::asString(in_RDI);
        QString::toLocal8Bit(in_stack_fffffffffffffe98);
        pcVar6 = QByteArray::constData((QByteArray *)0x10cda9);
        fprintf(pFVar8,"  -- Skipping file %s. Same or newer file already in place.\n",pcVar6);
        QByteArray::~QByteArray((QByteArray *)0x10cdcc);
      }
      local_111 = 1;
      bVar1 = true;
    }
    QFileInfo::~QFileInfo((QFileInfo *)&local_20);
    QFileInfo::~QFileInfo((QFileInfo *)&local_18);
    if (bVar1) goto LAB_0010d109;
  }
  QString::QString((QString *)0x10cec4);
  QDir::QDir(local_78,(QString *)local_90);
  QFileInfo::QFileInfo(local_b0,(QString *)in_RSI);
  QFileInfo::path();
  std::optional<QFlags<QFileDevice::Permission>_>::optional
            ((optional<QFlags<QFileDevice::Permission>_> *)&local_10);
  bVar4 = QDir::mkpath(local_78,local_a8,local_10);
  QString::~QString((QString *)0x10cf3d);
  QFileInfo::~QFileInfo(local_b0);
  QDir::~QDir(local_78);
  QString::~QString((QString *)0x10cf64);
  if (((bVar4 ^ 0xff) & 1) == 0) {
    uVar5 = QFile::exists((QString *)in_RSI);
    if (((uVar5 & 1) == 0) &&
       (uVar5 = QFile::copy((QString *)in_RDI,(QString *)in_RSI), pFVar8 = _stderr, (uVar5 & 1) == 0
       )) {
      QtPrivate::asString(in_RDI);
      QString::toLocal8Bit(in_stack_fffffffffffffe98);
      pcVar6 = QByteArray::constData((QByteArray *)0x10d030);
      QtPrivate::asString(in_RSI);
      QString::toLocal8Bit(in_stack_fffffffffffffe98);
      pcVar7 = QByteArray::constData((QByteArray *)0x10d05c);
      fprintf(pFVar8,"Failed to copy %s to %s.\n",pcVar6,pcVar7);
      QByteArray::~QByteArray((QByteArray *)0x10d084);
      QByteArray::~QByteArray((QByteArray *)0x10d091);
      local_111 = 0;
    }
    else {
      if ((*(byte *)(in_RDX + 1) & 1) != 0) {
        pFVar8 = _stdout;
        QtPrivate::asString(in_RSI);
        QString::toLocal8Bit(in_stack_fffffffffffffe98);
        pcVar6 = QByteArray::constData((QByteArray *)0x10d0d3);
        fprintf(pFVar8,"  -- Copied %s\n",pcVar6);
        QByteArray::~QByteArray((QByteArray *)0x10d0f3);
        fflush(_stdout);
      }
      local_111 = 1;
    }
  }
  else {
    pFVar8 = _stderr;
    QtPrivate::asString(in_RSI);
    QString::toLocal8Bit((QString *)pFVar8);
    pcVar6 = QByteArray::constData((QByteArray *)0x10cfa4);
    fprintf(pFVar8,"Cannot make output directory for %s.\n",pcVar6);
    QByteArray::~QByteArray((QByteArray *)0x10cfc7);
    local_111 = 0;
  }
LAB_0010d109:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(local_111 & 1);
}

Assistant:

bool copyFileIfNewer(const QString &sourceFileName,
                     const QString &destinationFileName,
                     const Options &options,
                     bool forceOverwrite = false)
{
    dependenciesForDepfile << sourceFileName;
    if (QFile::exists(destinationFileName)) {
        QFileInfo destinationFileInfo(destinationFileName);
        QFileInfo sourceFileInfo(sourceFileName);

        if (!forceOverwrite
                && sourceFileInfo.lastModified() <= destinationFileInfo.lastModified()
                && !alwaysOverwritableFile(destinationFileName)) {
            if (options.verbose)
                fprintf(stdout, "  -- Skipping file %s. Same or newer file already in place.\n", qPrintable(sourceFileName));
            return true;
        } else {
            if (!QFile(destinationFileName).remove()) {
                fprintf(stderr, "Can't remove old file: %s\n", qPrintable(destinationFileName));
                return false;
            }
        }
    }

    if (!QDir().mkpath(QFileInfo(destinationFileName).path())) {
        fprintf(stderr, "Cannot make output directory for %s.\n", qPrintable(destinationFileName));
        return false;
    }

    if (!QFile::exists(destinationFileName) && !QFile::copy(sourceFileName, destinationFileName)) {
        fprintf(stderr, "Failed to copy %s to %s.\n", qPrintable(sourceFileName), qPrintable(destinationFileName));
        return false;
    } else if (options.verbose) {
        fprintf(stdout, "  -- Copied %s\n", qPrintable(destinationFileName));
        fflush(stdout);
    }
    return true;
}